

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::anon_unknown_0::IsSpecialName
               (string *name,string *special_names,size_t count)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  string *psVar4;
  char *pcVar5;
  size_t length;
  size_t i;
  size_t count_local;
  string *special_names_local;
  string *name_local;
  
  length = 0;
  while( true ) {
    if (count <= length) {
      return false;
    }
    psVar3 = (string *)std::__cxx11::string::length();
    iVar2 = std::__cxx11::string::compare((ulong)name,0,psVar3);
    if (iVar2 == 0) break;
    length = length + 1;
  }
  psVar4 = (string *)std::__cxx11::string::length();
  if (psVar3 < psVar4) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)name);
    bVar1 = ascii_islower(*pcVar5);
    return (bool)((bVar1 ^ 0xffU) & 1);
  }
  return true;
}

Assistant:

bool IsSpecialName(const string& name, const string* special_names,
                   size_t count) {
  for (size_t i = 0; i < count; ++i) {
    size_t length = special_names[i].length();
    if (name.compare(0, length, special_names[i]) == 0) {
      if (name.length() > length) {
        // If name is longer than the retained_name[i] that it matches
        // the next character must be not lower case (newton vs newTon vs
        // new_ton).
        return !ascii_islower(name[length]);
      } else {
        return true;
      }
    }
  }
  return false;
}